

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_witness_program_from_bytes_using_version
              (uchar *bytes,size_t bytes_len,uint8_t witness_version,uint32_t flags,uchar *bytes_out
              ,size_t len,size_t *written)

{
  _Bool _Var1;
  char cVar2;
  uchar *p;
  size_t sStack_38;
  int ret;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint8_t witness_version_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (witness_version == '\0') {
    bytes_local._4_4_ =
         wally_witness_program_from_bytes(bytes,bytes_len,flags,bytes_out,len,written);
  }
  else {
    if (written != (size_t *)0x0) {
      *written = 0;
    }
    if (((((bytes_len == 0) || (bytes != (uchar *)0x0)) && (witness_version < 0x11)) &&
        ((_Var1 = script_flags_ok(flags,4), _Var1 && (bytes_out != (uchar *)0x0)))) &&
       ((len != 0 && (written != (size_t *)0x0)))) {
      if (((flags & 3) == 0) || (bytes_len != 0)) {
        sStack_38 = len;
        len_local = (size_t)bytes_out;
        if ((flags & 4) != 0) {
          if (len < 2) {
            return -2;
          }
          len_local = (size_t)(bytes_out + 1);
          sStack_38 = len - 1;
        }
        if (witness_version == '\0') {
          cVar2 = '\0';
        }
        else {
          cVar2 = witness_version + 'P';
        }
        *(char *)len_local = cVar2;
        bytes_local._4_4_ =
             wally_script_push_from_bytes
                       (bytes,bytes_len,flags & 0xfffffffb,(uchar *)(len_local + 1),sStack_38 - 1,
                        written);
        if ((bytes_local._4_4_ == 0) && (*written = *written + 1, (flags & 4) != 0)) {
          *bytes_out = (uchar)*written;
          *written = *written + 1;
        }
      }
      else {
        bytes_local._4_4_ = -2;
      }
    }
    else {
      bytes_local._4_4_ = -2;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_witness_program_from_bytes_using_version(
    const unsigned char *bytes, size_t bytes_len, uint8_t witness_version,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;
    unsigned char *p = bytes_out;

    if (witness_version == 0)
        return wally_witness_program_from_bytes(
            bytes, bytes_len, flags, bytes_out, len, written);

    if (written)
        *written = 0;

    if ((bytes_len && !bytes) || (witness_version > 16) ||
        !script_flags_ok(flags, WALLY_SCRIPT_AS_PUSH) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (flags & ALL_SCRIPT_HASH_FLAGS) {
        if (!bytes_len)
            return WALLY_EINVAL;
    }
    if (flags & WALLY_SCRIPT_AS_PUSH) {
        if (len < 2)
            return WALLY_EINVAL;
        ++bytes_out;
        --len;
    }

    /* Witness version */
    bytes_out[0] = (witness_version == 0) ? 0 : 0x50 + witness_version;
    ret = wally_script_push_from_bytes(bytes, bytes_len,
                                       flags & ~WALLY_SCRIPT_AS_PUSH,
                                       bytes_out + 1, len - 1, written);
    if (ret == WALLY_OK) {
        *written += 1; /* For Witness version byte */
        if (flags & WALLY_SCRIPT_AS_PUSH) {
            *p = *written & 0xff;
            *written += 1; /* For Witness version byte */
        }
    }
    return ret;
}